

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alhelpers.c
# Opt level: O2

int InitAL(char ***argv,int *argc)

{
  char **ppcVar1;
  char cVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  char *__ptr;
  
  if ((argv == (char ***)0x0 || argc == (int *)0x0) || (*argc < 2)) {
LAB_00102d3e:
    lVar4 = alcOpenDevice(0);
    if (lVar4 == 0) {
      __ptr = "Could not open a device!\n";
      goto LAB_00102e28;
    }
  }
  else {
    ppcVar1 = *argv;
    iVar3 = strcmp(*ppcVar1,"-device");
    if (iVar3 != 0) goto LAB_00102d3e;
    lVar4 = alcOpenDevice(ppcVar1[1]);
    if (lVar4 == 0) {
      fprintf(_stderr,"Failed to open \"%s\", trying default\n",(*argv)[1]);
      *argv = *argv + 2;
      *argc = *argc + -2;
      goto LAB_00102d3e;
    }
    *argv = *argv + 2;
    *argc = *argc + -2;
  }
  lVar5 = alcCreateContext(lVar4,0);
  if (lVar5 != 0) {
    cVar2 = alcMakeContextCurrent(lVar5);
    if (cVar2 != '\0') {
      cVar2 = alcIsExtensionPresent(lVar4,"ALC_ENUMERATE_ALL_EXT");
      if (((cVar2 == '\0') || (lVar5 = alcGetString(lVar4,0x1013), lVar5 == 0)) ||
         (iVar3 = alcGetError(lVar4), iVar3 != 0)) {
        lVar5 = alcGetString(lVar4,0x1005);
      }
      printf("Opened \"%s\"\n",lVar5);
      return 0;
    }
    alcDestroyContext(lVar5);
  }
  alcCloseDevice(lVar4);
  __ptr = "Could not set a context!\n";
LAB_00102e28:
  fwrite(__ptr,0x19,1,_stderr);
  return 1;
}

Assistant:

int InitAL(char ***argv, int *argc)
{
    const ALCchar *name;
    ALCdevice *device;
    ALCcontext *ctx;

    /* Open and initialize a device */
    device = NULL;
    if(argc && argv && *argc > 1 && strcmp((*argv)[0], "-device") == 0)
    {
        device = alcOpenDevice((*argv)[1]);
        if(!device)
            fprintf(stderr, "Failed to open \"%s\", trying default\n", (*argv)[1]);
        (*argv) += 2;
        (*argc) -= 2;
    }
    if(!device)
        device = alcOpenDevice(NULL);
    if(!device)
    {
        fprintf(stderr, "Could not open a device!\n");
        return 1;
    }

    ctx = alcCreateContext(device, NULL);
    if(ctx == NULL || alcMakeContextCurrent(ctx) == ALC_FALSE)
    {
        if(ctx != NULL)
            alcDestroyContext(ctx);
        alcCloseDevice(device);
        fprintf(stderr, "Could not set a context!\n");
        return 1;
    }

    name = NULL;
    if(alcIsExtensionPresent(device, "ALC_ENUMERATE_ALL_EXT"))
        name = alcGetString(device, ALC_ALL_DEVICES_SPECIFIER);
    if(!name || alcGetError(device) != AL_NO_ERROR)
        name = alcGetString(device, ALC_DEVICE_SPECIFIER);
    printf("Opened \"%s\"\n", name);

    return 0;
}